

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::PrepareVisitor::~PrepareVisitor(PrepareVisitor *this)

{
  BaseVisitor::~BaseVisitor(&this->super_BaseVisitor);
  operator_delete(this,0x28);
  return;
}

Assistant:

PrepareVisitor() : BaseVisitor() { visitorName = "prepareVisitor"; }